

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring_array.h
# Opt level: O0

int32_t ra_advance_until(roaring_array_t *ra,uint16_t x,int32_t pos)

{
  int32_t iVar1;
  int32_t in_EDX;
  uint16_t in_SI;
  int32_t *in_RDI;
  
  iVar1 = advanceUntil(*(uint16_t **)(in_RDI + 4),in_EDX,*in_RDI,in_SI);
  return iVar1;
}

Assistant:

static inline int32_t ra_advance_until(const roaring_array_t *ra, uint16_t x,
                                       int32_t pos) {
    return advanceUntil(ra->keys, pos, ra->size, x);
}